

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O2

void __thiscall
flatbuffers::FlatCompiler::LoadBinarySchema
          (FlatCompiler *this,Parser *parser,string *filename,string *contents)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  bVar1 = Parser::Deserialize(parser,(uint8_t *)(contents->_M_dataplus)._M_p,
                              contents->_M_string_length);
  if (!bVar1) {
    std::operator+(&bStack_38,"failed to load binary schema: ",filename);
    (*(this->params_).error_fn)(this,&bStack_38,false,false);
    std::__cxx11::string::~string((string *)&bStack_38);
  }
  return;
}

Assistant:

void FlatCompiler::LoadBinarySchema(flatbuffers::Parser &parser,
                                    const std::string &filename,
                                    const std::string &contents) {
  if (!parser.Deserialize(reinterpret_cast<const uint8_t *>(contents.c_str()),
                          contents.size())) {
    Error("failed to load binary schema: " + filename, false, false);
  }
}